

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int * Gia_ManHashFind(Gia_Man_t *p,int iLit0,int iLit1,int iLitC)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pThis;
  int *pPlace;
  int iThis;
  int iLitC_local;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vHTable);
  iVar1 = Gia_ManHashOne(iLit0,iLit1,iLitC,iVar1);
  pThis = (Gia_Obj_t *)Vec_IntEntryP(&p->vHTable,iVar1);
  iVar1 = Vec_IntSize(&p->vHash);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(&p->vHash) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x39,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  if ((p->pMuxes == (uint *)0x0) && (iLit1 <= iLit0)) {
    __assert_fail("p->pMuxes || iLit0 < iLit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x3a,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  if ((iLit1 <= iLit0) &&
     ((iVar1 = Abc_LitIsCompl(iLit0), iVar1 != 0 || (iVar1 = Abc_LitIsCompl(iLit1), iVar1 != 0)))) {
    __assert_fail("iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x3b,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  if ((iLitC != -1) && (iVar1 = Abc_LitIsCompl(iLit1), iVar1 != 0)) {
    __assert_fail("iLitC == -1 || !Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x3c,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  do {
    iVar1 = *(int *)pThis;
    if (iVar1 == 0) {
      return (int *)pThis;
    }
    pObj = Gia_ManObj(p,iVar1);
    iVar2 = Gia_ObjFaninLit0(pObj,iVar1);
    if ((iVar2 == iLit0) && (iVar2 = Gia_ObjFaninLit1(pObj,iVar1), iVar2 == iLit1)) {
      if (p->pMuxes == (uint *)0x0) {
        return (int *)pThis;
      }
      iVar2 = Gia_ObjFaninLit2p(p,pObj);
      if (iVar2 == iLitC) {
        return (int *)pThis;
      }
    }
    pThis = (Gia_Obj_t *)Vec_IntEntryP(&p->vHash,iVar1);
  } while( true );
}

Assistant:

static inline int * Gia_ManHashFind( Gia_Man_t * p, int iLit0, int iLit1, int iLitC )
{
    int iThis, * pPlace = Vec_IntEntryP( &p->vHTable, Gia_ManHashOne( iLit0, iLit1, iLitC, Vec_IntSize(&p->vHTable) ) );
    assert( Vec_IntSize(&p->vHash) == Gia_ManObjNum(p) );
    assert( p->pMuxes || iLit0 < iLit1 );
    assert( iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)) );
    assert( iLitC == -1 || !Abc_LitIsCompl(iLit1) );
    for ( ; (iThis = *pPlace); pPlace = Vec_IntEntryP(&p->vHash, iThis) )
    {
        Gia_Obj_t * pThis = Gia_ManObj( p, iThis );
        if ( Gia_ObjFaninLit0(pThis, iThis) == iLit0 && Gia_ObjFaninLit1(pThis, iThis) == iLit1 && (p->pMuxes == NULL || Gia_ObjFaninLit2p(p, pThis) == iLitC) )
            break;
    }
    return pPlace;
}